

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

basic_substring<char> __thiscall
c4::basic_substring<char>::trimr(basic_substring<char> *this,ro_substr chars)

{
  code *pcVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *in_R9;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  basic_substring<char> bVar9;
  basic_substring<char> local_28;
  
  uVar4 = chars.len;
  pcVar3 = (char *)this->len;
  if (this->str != (char *)0x0 && pcVar3 != (char *)0x0) {
    pcVar5 = pcVar3;
    do {
      bVar8 = pcVar5 == (char *)0x0;
      pcVar5 = pcVar5 + -1;
      if (bVar8) {
        in_R9 = (char *)0xffffffffffffffff;
        break;
      }
      pcVar6 = pcVar5;
      bVar8 = uVar4 != 0;
      if (uVar4 != 0) {
        bVar8 = true;
        pcVar6 = in_R9;
        if (pcVar5[(long)this->str] != *chars.str) {
          uVar2 = 1;
          do {
            uVar7 = uVar2;
            pcVar6 = pcVar5;
            if (uVar4 == uVar7) break;
            pcVar6 = in_R9;
            uVar2 = uVar7 + 1;
          } while (pcVar5[(long)this->str] != chars.str[uVar7]);
          bVar8 = uVar7 < uVar4;
        }
      }
      in_R9 = pcVar6;
    } while (bVar8);
    if (in_R9 != (char *)0xffffffffffffffff) {
      pcVar5 = in_R9 + 1;
      if (pcVar5 != (char *)0xffffffffffffffff && pcVar3 <= in_R9) {
        if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar1 = (code *)swi(3);
          bVar9 = (basic_substring<char>)(*pcVar1)();
          return bVar9;
        }
        handle_error(0x1fbf87,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
      }
      if (pcVar5 == (char *)0xffffffffffffffff) {
        pcVar5 = (char *)this->len;
      }
      if ((char *)this->len < pcVar5) {
        if (((s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar1 = (code *)swi(3);
          bVar9 = (basic_substring<char>)(*pcVar1)();
          return bVar9;
        }
        handle_error(0x1fbf87,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
      }
      basic_substring(&local_28,this->str,(size_t)pcVar5);
      pcVar3 = local_28.str;
      uVar4 = local_28.len;
    }
    if (in_R9 != (char *)0xffffffffffffffff) goto LAB_001eb7f6;
  }
  pcVar3 = this->str;
  uVar4 = 0;
LAB_001eb7f6:
  bVar9.len = uVar4;
  bVar9.str = pcVar3;
  return bVar9;
}

Assistant:

basic_substring trimr(ro_substr chars) const
    {
        if( ! empty())
        {
            size_t pos = last_not_of(chars, npos);
            if(pos != npos)
                return sub(0, pos+1);
        }
        return sub(0, 0);
    }